

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

void __thiscall
CTPNStmCompBase::CTPNStmCompBase(CTPNStmCompBase *this,CTPNStm *first_stm,CTcPrsSymtab *symtab)

{
  CTcTokFileDesc *pCVar1;
  CTPNStm *pCVar2;
  long in_RDX;
  CTcTokFileDesc *in_RSI;
  CTPNStm *in_RDI;
  
  CTPNStm::CTPNStm(in_RDI);
  (in_RDI->super_CTPNStmBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
       (_func_int **)&PTR_gen_code_003d4360;
  in_RDI[1].super_CTPNStmBase.file_ = in_RSI;
  in_RDI[1].super_CTPNStmBase.linenum_ = in_RDX;
  *(byte *)&in_RDI[2].super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
       *(byte *)&in_RDI[2].super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
                 _vptr_CTcPrsNodeBase & 0xfe;
  pCVar1 = CTcTokenizer::get_last_desc(G_tok);
  in_RDI[1].super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
       (_func_int **)pCVar1;
  pCVar2 = (CTPNStm *)CTcTokenizer::get_last_linenum(G_tok);
  in_RDI[1].super_CTPNStmBase.next_stm_ = pCVar2;
  return;
}

Assistant:

CTPNStmCompBase::CTPNStmCompBase(CTPNStm *first_stm, CTcPrsSymtab *symtab)
{
    /* remember the first statement in our statement list */
    first_stm_ = first_stm;
    
    /* remember our local symbol table */
    symtab_ = symtab;
    
    /* 
     *   presume we don't have our own private symbol table, but will
     *   simply use our parent's 
     */
    has_own_scope_ = FALSE;

    /* 
     *   remember the source location of the closing brace, which should
     *   be the current location when we're instantiated 
     */
    end_desc_ = G_tok->get_last_desc();
    end_linenum_ = G_tok->get_last_linenum();
}